

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

bool __thiscall xatlas::internal::segment::Atlas::relocateSeed(Atlas *this,Chart *chart)

{
  Array<unsigned_int> *this_00;
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  float face;
  uint *puVar4;
  float *pfVar5;
  uint *puVar6;
  uint32_t i;
  uint32_t index;
  float index_00;
  uint index_01;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  Vector3 local_40;
  
  uVar1 = (chart->faces).m_base.size;
  (this->m_bestTriangles).m_pairs.m_base.size = 0;
  for (index = 0; uVar1 != index; index = index + 1) {
    puVar4 = Array<unsigned_int>::operator[](&chart->faces,index);
    fVar7 = evaluateProxyFitMetric(this,chart,*puVar4);
    puVar4 = Array<unsigned_int>::operator[](&chart->faces,index);
    CostQueue::push(&this->m_bestTriangles,fVar7,*puVar4);
  }
  fVar7 = -1.0;
  face = 0.0;
  while (index_00 = face, fVar8 = fVar7, (this->m_bestTriangles).m_pairs.m_base.size != 0) {
    face = (float)CostQueue::pop(&this->m_bestTriangles);
    local_40 = Mesh::computeFaceCenter(this->m_mesh,(uint32_t)face);
    VVar9 = operator-(&chart->centroid,&local_40);
    fVar7 = SQRT(VVar9.z * VVar9.z + VVar9.x * VVar9.x + VVar9.y * VVar9.y);
    if (fVar7 <= fVar8) {
      fVar7 = fVar8;
      face = index_00;
    }
  }
  local_40.x = index_00;
  if (fVar8 < 0.0) {
    __assert_fail("maxDistance >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x151c,"bool xatlas::internal::segment::Atlas::relocateSeed(Chart *)");
  }
  this_00 = &chart->seeds;
  index_01 = 0;
  do {
    uVar2 = (chart->seeds).m_base.size;
    if (uVar2 <= index_01) {
      ArrayBase::push_back(&this_00->m_base,(uint8_t *)&local_40);
LAB_001a3ba9:
      return uVar2 <= index_01;
    }
    pfVar5 = (float *)Array<unsigned_int>::operator[](this_00,index_01);
    if (*pfVar5 == index_00) {
LAB_001a3b6e:
      uVar1 = (chart->seeds).m_base.size;
      puVar4 = Array<unsigned_int>::operator[](this_00,index_01);
      puVar6 = Array<unsigned_int>::operator[](this_00,uVar1 - 1);
      uVar3 = *puVar4;
      *puVar4 = *puVar6;
      *puVar6 = uVar3;
      goto LAB_001a3ba9;
    }
    puVar4 = Array<unsigned_int>::operator[](this_00,index_01);
    puVar4 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,*puVar4);
    uVar3 = *puVar4;
    puVar4 = Array<unsigned_int>::operator[](&this->m_facePlanarRegionId,(uint32_t)index_00);
    if (uVar3 == *puVar4) goto LAB_001a3b6e;
    index_01 = index_01 + 1;
  } while( true );
}

Assistant:

bool relocateSeed(Chart *chart)
	{
		// Find the first N triangles that fit the proxy best.
		const uint32_t faceCount = chart->faces.size();
		m_bestTriangles.clear();
		for (uint32_t i = 0; i < faceCount; i++) {
			const float cost = evaluateProxyFitMetric(chart, chart->faces[i]);
			m_bestTriangles.push(cost, chart->faces[i]);
		}
		// Of those, choose the least central triangle.
		uint32_t leastCentral = 0;
		float maxDistance = -1;
		for (;;) {
			if (m_bestTriangles.count() == 0)
				break;
			const uint32_t face = m_bestTriangles.pop();
			Vector3 faceCentroid = m_mesh->computeFaceCenter(face);
			const float distance = length(chart->centroid - faceCentroid);
			if (distance > maxDistance) {
				maxDistance = distance;
				leastCentral = face;
			}
		}
		XA_DEBUG_ASSERT(maxDistance >= 0);
		// In order to prevent k-means cyles we record all the previously chosen seeds.
		for (uint32_t i = 0; i < chart->seeds.size(); i++) {
			// Treat seeds belong to the same planar region as equal.
			if (chart->seeds[i] == leastCentral || m_facePlanarRegionId[chart->seeds[i]] == m_facePlanarRegionId[leastCentral]) {
				// Move new seed to the end of the seed array.
				uint32_t last = chart->seeds.size() - 1;
				swap(chart->seeds[i], chart->seeds[last]);
				return false;
			}
		}
		// Append new seed.
		chart->seeds.push_back(leastCentral);
		return true;
	}